

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall
Lodtalk::AST::IdentifierExpression::IdentifierExpression
          (IdentifierExpression *this,string *identifier)

{
  string *identifier_local;
  IdentifierExpression *this_local;
  
  Node::Node(&this->super_Node);
  (this->super_Node)._vptr_Node = (_func_int **)&PTR__IdentifierExpression_0020ca68;
  std::__cxx11::string::string((string *)&this->identifier,(string *)identifier);
  std::shared_ptr<Lodtalk::VariableLookup>::shared_ptr(&this->variable);
  return;
}

Assistant:

IdentifierExpression::IdentifierExpression(const std::string &identifier)
	: identifier(identifier)
{
}